

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# geometry.h
# Opt level: O2

int * __thiscall vec<2UL,_int>::operator[](vec<2UL,_int> *this,size_t i)

{
  if (i < 2) {
    return &this->x + (i != 0);
  }
  __assert_fail("i >= 0 && i < 2",
                "/workspace/llm4binary/github/license_all_cmakelists_1510/cdgiessen[P]TinyRenderer/ext/geometry.h"
                ,0x71,"T &vec<2, int>::operator[](const size_t) [n = 2, T = int]");
}

Assistant:

T& operator[](const size_t i)
    {
        assert(i >= 0 && i < 2);
        return i == 0 ? x : y;
    }